

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O0

map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
* dominac_frontier(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *dom,
                  map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                  *nodes)

{
  bool bVar1;
  iterator this;
  pointer ppVar2;
  size_type sVar3;
  key_type *__k;
  key_type *pkVar4;
  reference ppBVar5;
  mapped_type *pmVar6;
  vector<int,_std::allocator<int>_> *in_RDX;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *in_RDI;
  iterator i;
  vector<int,_std::allocator<int>_> b_1;
  vector<int,_std::allocator<int>_> b;
  int idom_b;
  iterator itt;
  int runner;
  int i_1;
  iterator it;
  iterator iter;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *dom_f;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffffed8;
  mapped_type *in_stack_fffffffffffffee0;
  mapped_type *in_stack_fffffffffffffee8;
  mapped_type *in_stack_fffffffffffffef0;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *this_00;
  _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_> local_b8;
  _Base_ptr local_b0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff78;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff80;
  _Self local_78;
  _Base_ptr local_70;
  int local_64;
  _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_> local_60;
  int local_54;
  int local_50;
  _Base_ptr local_40;
  _Self local_38;
  _Base_ptr local_30;
  _Rb_tree_iterator<std::pair<const_int,_int>_> local_28;
  undefined1 local_19;
  
  local_19 = 0;
  this_00 = in_RDI;
  std::
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::map((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
         *)0x27fd03);
  std::_Rb_tree_iterator<std::pair<const_int,_int>_>::_Rb_tree_iterator(&local_28);
  local_30 = (_Base_ptr)
             std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                       (in_stack_fffffffffffffed8);
  local_28._M_node = local_30;
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                   (in_stack_fffffffffffffed8);
    bVar1 = std::operator!=(&local_28,&local_38);
    if (!bVar1) break;
    std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)0x27fd6f);
    this = std::
           map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
           ::find((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                   *)in_stack_fffffffffffffed8,(key_type *)0x27fd7c);
    local_40 = this._M_node;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::
             operator->((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_> *)
                        0x27fd9d);
    sVar3 = std::
            vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
            ::size(&ppVar2->second->preBlock);
    if (1 < sVar3) {
      local_50 = 0;
      while( true ) {
        __k = (key_type *)(long)local_50;
        ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::
                 operator->((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>
                             *)0x27fdd9);
        pkVar4 = (key_type *)
                 std::
                 vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
                 ::size(&ppVar2->second->preBlock);
        if (pkVar4 <= __k) break;
        ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::
                 operator->((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>
                             *)0x27fe09);
        ppBVar5 = std::
                  vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
                  ::operator[](&ppVar2->second->preBlock,(long)local_50);
        local_54 = (*ppBVar5)->id;
        std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
        _Rb_tree_iterator(&local_60);
        std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_> *)
                   0x27fe41);
        pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)this._M_node,__k);
        local_64 = *pmVar6;
        while (local_54 != local_64) {
          local_70 = (_Base_ptr)
                     std::
                     map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ::find((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                             *)in_stack_fffffffffffffed8,(key_type *)0x27fe89);
          local_60._M_node = local_70;
          local_78._M_node =
               (_Base_ptr)
               std::
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::end((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      *)in_stack_fffffffffffffed8);
          bVar1 = std::operator==(&local_60,&local_78);
          if (bVar1) {
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)0x27feef);
            std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::
            operator->((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_> *)
                       0x27fefc);
            std::vector<int,_std::allocator<int>_>::push_back
                      (in_stack_fffffffffffffef0,(value_type_conflict3 *)in_stack_fffffffffffffee8);
            in_stack_fffffffffffffef0 =
                 std::
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                               *)this._M_node,__k);
            std::vector<int,_std::allocator<int>_>::operator=
                      (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
            std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffef0);
          }
          else {
            std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
            operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                        *)0x27ff96);
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)this_00,in_RDX);
            std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::
            operator->((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_> *)
                       0x27ffb9);
            std::vector<int,_std::allocator<int>_>::push_back
                      (in_stack_fffffffffffffef0,(value_type_conflict3 *)in_stack_fffffffffffffee8);
            in_stack_fffffffffffffee8 =
                 std::
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                               *)this._M_node,__k);
            std::vector<int,_std::allocator<int>_>::operator=
                      (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
            std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffef0);
          }
          in_stack_fffffffffffffee0 =
               std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)this._M_node,__k);
          local_54 = *in_stack_fffffffffffffee0;
        }
        local_50 = local_50 + 1;
      }
    }
    local_b0 = (_Base_ptr)
               std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++
                         ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)in_stack_fffffffffffffee8
                          ,(int)((ulong)in_stack_fffffffffffffee0 >> 0x20));
  }
  std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
  _Rb_tree_iterator(&local_b8);
  return in_RDI;
}

Assistant:

map<int, vector<int>> dominac_frontier(map<int, int> dom,
                                       map<int, BasicBlock*> nodes) {
  map<int, vector<int>> dom_f;
  map<int, int>::iterator iter;
  for (iter = dom.begin(); iter != dom.end(); iter++) {
    map<int, BasicBlock*>::iterator it = nodes.find(iter->first);
    if (it->second->preBlock.size() > 1) {
      for (int i = 0; i < it->second->preBlock.size(); i++) {
        int runner = it->second->preBlock[i]->id;
        map<int, vector<int>>::iterator itt;
        int idom_b = dom[it->first];
        while (runner != idom_b) {
          // add b to runner's dominance frontier set
          itt = dom_f.find(runner);
          if (itt == dom_f.end()) {
            vector<int> b;
            b.push_back(it->first);
            dom_f[runner] = b;
          } else {
            vector<int> b = itt->second;
            b.push_back(it->first);
            dom_f[runner] = b;
          }
          // runner := idom(runner)
          runner = dom[runner];
        }
      }
    }
  }
  map<int, vector<int>>::iterator i;
  /*cout << endl << "*** desplay dominac frontier ***" << endl;
  for (i = dom_f.begin(); i != dom_f.end(); i++) {
      cout << i->first;
      for (int j = 0; j < i->second.size(); j++) {
          cout << " " << i->second[j];
      }
      cout << endl;
  }*/
  return dom_f;
}